

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O2

void Npn_ManResize(Npn_Man_t *p)

{
  uint uVar1;
  int *__ptr;
  word wVar2;
  int iVar3;
  int *piVar4;
  Npn_Obj_t *pNVar5;
  Npn_Obj_t *pNVar6;
  Npn_Obj_t *pNVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  timespec local_40;
  
  if (p->pBins == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x18d,"void Npn_ManResize(Npn_Man_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pBins;
  uVar1 = p->nBins;
  iVar3 = Abc_PrimeCudd(uVar1 * 3);
  p->nBins = iVar3;
  piVar4 = (int *)calloc((long)iVar3,4);
  p->pBins = piVar4;
  uVar10 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar10;
  }
  iVar3 = 1;
  do {
    if (uVar10 == uVar9) {
      if (iVar3 == p->nEntries) {
        free(__ptr);
        return;
      }
      __assert_fail("Counter == p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                    ,0x1a5,"void Npn_ManResize(Npn_Man_t *)");
    }
    pNVar5 = Npn_ManObj(p,__ptr[uVar10]);
    if (pNVar5 == (Npn_Obj_t *)0x0) {
      pNVar6 = (Npn_Obj_t *)0x0;
    }
    else {
      pNVar6 = Npn_ManObj(p,pNVar5->iNext);
    }
    while (pNVar7 = pNVar6, pNVar5 != (Npn_Obj_t *)0x0) {
      piVar4 = p->pBins;
      wVar2 = pNVar5->uTruth;
      iVar8 = (int)((wVar2 * 0x6f1 ^ wVar2 * 0x2dd ^ wVar2 * 0x65) % (ulong)(long)p->nBins);
      pNVar5->iNext = piVar4[iVar8];
      if (pNVar5 <= p->pBuffer) {
        __assert_fail("p->pBuffer < pObj",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                      ,0x32,"int Npn_ManObjNum(Npn_Man_t *, Npn_Obj_t *)");
      }
      piVar4[iVar8] = (int)((ulong)((long)pNVar5 - (long)p->pBuffer) >> 4);
      if (pNVar7 == (Npn_Obj_t *)0x0) {
        pNVar6 = (Npn_Obj_t *)0x0;
      }
      else {
        pNVar6 = Npn_ManObj(p,pNVar7->iNext);
      }
      iVar3 = iVar3 + 1;
      pNVar5 = pNVar7;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void Npn_ManResize( Npn_Man_t * p )
{
    Npn_Obj_t * pEntry, * pNext;
    int * pBinsOld, * ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // rehash the entries from the old table
    Counter = 1;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = Npn_ManObj(p, pBinsOld[i]), 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL; 
          pEntry; 
          pEntry = pNext, 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL )
    {
        // get the place where this entry goes 
        ppPlace = p->pBins + Npn_ManHash( p, pEntry->uTruth );
        // add the entry to the list
        pEntry->iNext = *ppPlace;
        *ppPlace = Npn_ManObjNum( p, pEntry );
        Counter++;
    }
    assert( Counter == p->nEntries );
    ABC_FREE( pBinsOld );
//ABC_PRT( "Hash table resizing time", Abc_Clock() - clk );
}